

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin.c
# Opt level: O2

int coda_bin_product_close(coda_bin_product *product)

{
  if (product->use_mmap == 0) {
    if (-1 < product->fd) {
      close(product->fd);
      product->fd = -1;
    }
  }
  else {
    if (product->mem_ptr != (uint8_t *)0x0) {
      munmap(product->mem_ptr,product->file_size);
      product->mem_ptr = (uint8_t *)0x0;
    }
    product->use_mmap = 0;
  }
  return 0;
}

Assistant:

int coda_bin_product_close(coda_bin_product *product)
{
    if (product->use_mmap)
    {
#ifdef WIN32
        if (product->mem_ptr != NULL)
        {
            UnmapViewOfFile(product->mem_ptr);
            product->mem_ptr = NULL;
        }
        if (product->file_mapping != INVALID_HANDLE_VALUE)
        {
            CloseHandle(product->file_mapping);
            product->file_mapping = INVALID_HANDLE_VALUE;
        }
        if (product->file != INVALID_HANDLE_VALUE)
        {
            CloseHandle(product->file);
            product->file = INVALID_HANDLE_VALUE;
        }
#else
        if (product->mem_ptr != NULL)
        {
            munmap((void *)product->mem_ptr, product->file_size);
            product->mem_ptr = NULL;
        }
#endif
        product->use_mmap = 0;
    }
    else
    {
        if (product->fd >= 0)
        {
            close(product->fd);
            product->fd = -1;
        }
    }

    return 0;
}